

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O0

void Cnf_SopConvertToVector(char *pSop,int nCubes,Vec_Int_t *vCover)

{
  int local_48;
  int local_44;
  int b;
  int i;
  int iCube;
  int Cube;
  int Lits [4];
  Vec_Int_t *vCover_local;
  int nCubes_local;
  char *pSop_local;
  
  Vec_IntClear(vCover);
  for (local_44 = 0; local_44 < nCubes; local_44 = local_44 + 1) {
    i = (int)pSop[local_44];
    for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
      if (i % 3 == 0) {
        (&iCube)[local_48] = 1;
      }
      else if (i % 3 == 1) {
        (&iCube)[local_48] = 2;
      }
      else {
        (&iCube)[local_48] = 0;
      }
      i = i / 3;
    }
    b = 0;
    for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
      b = b << 2 | (&iCube)[local_48];
    }
    Vec_IntPush(vCover,b);
  }
  return;
}

Assistant:

void Cnf_SopConvertToVector( char * pSop, int nCubes, Vec_Int_t * vCover )
{
    int Lits[4], Cube, iCube, i, b;
    Vec_IntClear( vCover );
    for ( i = 0; i < nCubes; i++ )
    {
        Cube = pSop[i];
        for ( b = 0; b < 4; b++ )
        {
            if ( Cube % 3 == 0 )
                Lits[b] = 1;
            else if ( Cube % 3 == 1 )
                Lits[b] = 2;
            else
                Lits[b] = 0;
            Cube = Cube / 3;
        }
        iCube = 0;
        for ( b = 0; b < 4; b++ )
            iCube = (iCube << 2) | Lits[b];
        Vec_IntPush( vCover, iCube );
    }
}